

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::EnumerateObjects
          (LargeHeapBlock *this,ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction
          )

{
  byte bVar1;
  LargeObjectHeader *this_00;
  uint index;
  
  if (this->allocCount != 0) {
    index = 0;
    do {
      this_00 = GetHeaderByIndex(this,index);
      if ((this_00 != (LargeObjectHeader *)0x0) &&
         (bVar1 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie),
         (bVar1 & infoBits) != NoBit)) {
        (*CallBackFunction)(this_00 + 1,this_00->objectSize);
      }
      index = index + 1;
    } while (index < this->allocCount);
  }
  return;
}

Assistant:

void
LargeHeapBlock::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }
        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & infoBits) != 0)
        {
            CallBackFunction(header->GetAddress(), header->objectSize);
        }
    }
}